

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::TableMacroExtractor::GetMacroDefinition
                  (Value *__return_storage_ptr__,TableMacroCatalogEntry *entry,idx_t offset)

{
  reference this;
  type this_00;
  TableMacroFunction *pTVar1;
  pointer pQVar2;
  LogicalType LStack_48;
  string local_30;
  
  this = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
         ::operator[](&(entry->super_MacroCatalogEntry).macros,offset);
  this_00 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
            operator*(this);
  if (this_00->type == TABLE_MACRO) {
    pTVar1 = MacroFunction::Cast<duckdb::TableMacroFunction>(this_00);
    pQVar2 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&pTVar1->query_node);
    (*pQVar2->_vptr_QueryNode[3])(&local_30,pQVar2);
    Value::Value(__return_storage_ptr__,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  else {
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value GetMacroDefinition(TableMacroCatalogEntry &entry, idx_t offset) {
		auto &macro_entry = *entry.macros[offset];
		if (macro_entry.type == MacroType::TABLE_MACRO) {
			auto &func = macro_entry.Cast<TableMacroFunction>();
			return func.query_node->ToString();
		}
		return Value();
	}